

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O1

pair<ska::detailv3::sherwood_v3_table<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_const_slang::ast::Symbol_*,_slang::Hasher<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::Hasher<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::equal_to<const_slang::ast::Symbol_*>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>_>::templated_iterator<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,slang::ast::Symbol_const*,slang::Hasher<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,slang::Hasher<slang::ast::Symbol_const*>>,std::equal_to<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueEquality<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,std::equal_to<slang::ast::Symbol_const*>>,std::allocator<std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>>
::
emplace_new_key<std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>
          (sherwood_v3_table<std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,slang::ast::Symbol_const*,slang::Hasher<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,slang::Hasher<slang::ast::Symbol_const*>>,std::equal_to<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueEquality<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,std::equal_to<slang::ast::Symbol_const*>>,std::allocator<std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,
          pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>
          *key)

{
  tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *ptVar1;
  Symbol *pSVar2;
  AssertionInstanceDetails *pAVar3;
  PropertyExprSyntax *pPVar4;
  not_null<const_slang::ast::Scope_*> nVar5;
  underlying_type uVar6;
  Symbol *pSVar7;
  TempVarSymbol *pTVar8;
  RandomizeDetails *pRVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  _Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *p_Var12;
  SymbolIndex SVar13;
  undefined4 uVar14;
  long lVar15;
  char cVar16;
  long lVar17;
  ulong uVar18;
  EntryPointer psVar20;
  EntryPointer psVar21;
  Symbol *__tmp_1;
  PropertyExprSyntax *pPVar22;
  Symbol *__tmp_4;
  Symbol *pSVar23;
  undefined4 in_R10D;
  uint uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  pair<ska::detailv3::sherwood_v3_table<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_const_slang::ast::Symbol_*,_slang::Hasher<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::Hasher<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::equal_to<const_slang::ast::Symbol_*>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>_>::templated_iterator<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_bool>
  pVar27;
  undefined1 auVar28 [16];
  ASTContext __tmp_2;
  pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>
  local_58;
  undefined7 uVar19;
  
  if ((*(long *)(this + 8) != 0) &&
     (this[0x11] !=
      (sherwood_v3_table<std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,slang::ast::Symbol_const*,slang::Hasher<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,slang::Hasher<slang::ast::Symbol_const*>>,std::equal_to<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueEquality<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,std::equal_to<slang::ast::Symbol_const*>>,std::allocator<std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>>
       )distance_from_desired)) {
    lVar17 = *(long *)(this + 0x18) + 1;
    auVar25._8_4_ = (int)((ulong)lVar17 >> 0x20);
    auVar25._0_8_ = lVar17;
    auVar25._12_4_ = 0x45300000;
    lVar15 = *(long *)(this + 8) + 1;
    auVar26._8_4_ = (int)((ulong)lVar15 >> 0x20);
    auVar26._0_8_ = lVar15;
    auVar26._12_4_ = 0x45300000;
    if ((auVar25._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar17) - 4503599627370496.0) <=
        (double)*(float *)(this + 0x14) *
        ((auVar26._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar15) - 4503599627370496.0))) {
      cVar16 = current_entry->distance_from_desired;
      uVar19 = (undefined7)((ulong)lVar17 >> 8);
      uVar18 = CONCAT71(uVar19,cVar16);
      if (cVar16 < '\0') {
        (current_entry->field_1).value.first = key->first;
        p_Var12 = &(key->second).
                   super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
        ;
        SVar13 = (p_Var12->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
                 super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex;
        uVar14 = *(undefined4 *)
                  &(p_Var12->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
                   super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.field_0xc;
        uVar6 = (key->second).
                super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits;
        pSVar2 = (key->second).
                 super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                 .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                 super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc;
        pTVar8 = (key->second).
                 super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                 .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                 super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar;
        pRVar9 = (key->second).
                 super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                 .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                 super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.randomizeDetails;
        (current_entry->field_1).value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr =
             (key->second).
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr;
        p_Var12 = &(current_entry->field_1).value.second.
                   super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
        ;
        (p_Var12->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex = SVar13;
        *(undefined4 *)
         &(p_Var12->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
          super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.field_0xc = uVar14;
        (current_entry->field_1).value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits = uVar6;
        (current_entry->field_1).value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc = pSVar2;
        (current_entry->field_1).value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar = pTVar8;
        (current_entry->field_1).value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.randomizeDetails = pRVar9;
        (current_entry->field_1).value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.assertionInstance =
             (key->second).
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.assertionInstance;
        (current_entry->field_1).value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false>._M_head_impl =
             (key->second).
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             .super__Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false>._M_head_impl;
        current_entry->distance_from_desired = distance_from_desired;
      }
      else {
        pSVar2 = key->first;
        nVar5.ptr = (key->second).
                    super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                    .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                    super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr;
        p_Var12 = &(key->second).
                   super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
        ;
        SVar13 = (p_Var12->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
                 super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex;
        uVar14 = *(undefined4 *)
                  &(p_Var12->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
                   super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.field_0xc;
        uVar6 = (key->second).
                super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits;
        pSVar7 = (key->second).
                 super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                 .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                 super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc;
        pTVar8 = (key->second).
                 super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                 .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                 super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar;
        pRVar9 = (key->second).
                 super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                 .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                 super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.randomizeDetails;
        pAVar3 = (key->second).
                 super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                 .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                 super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.assertionInstance
        ;
        pPVar4 = (key->second).
                 super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                 .super__Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false>.
                 _M_head_impl;
        current_entry->distance_from_desired = distance_from_desired;
        pSVar23 = (current_entry->field_1).value.first;
        (current_entry->field_1).value.first = pSVar2;
        pPVar22 = (current_entry->field_1).value.second.
                  super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                  .super__Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false>.
                  _M_head_impl;
        (current_entry->field_1).value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false>._M_head_impl =
             pPVar4;
        local_58.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.assertionInstance =
             (current_entry->field_1).value.second.
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.assertionInstance;
        local_58.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr =
             (current_entry->field_1).value.second.
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr;
        p_Var12 = &(current_entry->field_1).value.second.
                   super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
        ;
        local_58.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex =
             (p_Var12->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex;
        local_58.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl._12_4_ =
             *(undefined4 *)
              &(p_Var12->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
               super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.field_0xc;
        local_58.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits =
             (current_entry->field_1).value.second.
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits;
        local_58.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc =
             (current_entry->field_1).value.second.
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc;
        local_58.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar =
             (current_entry->field_1).value.second.
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar;
        local_58.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.randomizeDetails =
             (current_entry->field_1).value.second.
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.randomizeDetails;
        (current_entry->field_1).value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.assertionInstance = pAVar3
        ;
        (current_entry->field_1).value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar = pTVar8;
        (current_entry->field_1).value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.randomizeDetails = pRVar9;
        (current_entry->field_1).value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits = uVar6;
        (current_entry->field_1).value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc = pSVar7;
        (current_entry->field_1).value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr = nVar5.ptr;
        p_Var12 = &(current_entry->field_1).value.second.
                   super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
        ;
        (p_Var12->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex = SVar13;
        *(undefined4 *)
         &(p_Var12->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
          super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.field_0xc = uVar14;
        uVar18 = CONCAT71(uVar19,cVar16 + '\x01');
        psVar20 = current_entry + 1;
        uVar24 = CONCAT31((int3)((uint)in_R10D >> 8),current_entry[1].distance_from_desired);
        psVar21 = current_entry;
        if (-1 < current_entry[1].distance_from_desired) {
          ptVar1 = &(current_entry->field_1).value.second;
          do {
            psVar21 = psVar20;
            cVar16 = (char)uVar18;
            if ((char)uVar24 < cVar16) {
              psVar21->distance_from_desired = cVar16;
              pSVar2 = (psVar21->field_1).value.first;
              pPVar4 = (psVar21->field_1).value.second.
                       super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                       .super__Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false>.
                       _M_head_impl;
              (psVar21->field_1).value.first = pSVar23;
              (psVar21->field_1).value.second.
              super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
              .super__Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false>._M_head_impl
                   = pPVar22;
              pAVar3 = (psVar21->field_1).value.second.
                       super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                       .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                       super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                       assertionInstance;
              nVar5.ptr = (psVar21->field_1).value.second.
                          super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                          .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                          super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.
                          ptr;
              p_Var12 = &(psVar21->field_1).value.second.
                         super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
              ;
              uVar10._0_4_ = (p_Var12->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
                             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                             lookupIndex;
              uVar10._4_4_ = *(undefined4 *)
                              &(p_Var12->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
                               super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                               field_0xc;
              uVar6 = (psVar21->field_1).value.second.
                      super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                      .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                      super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits
              ;
              pSVar7 = (psVar21->field_1).value.second.
                       super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                       .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                       super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                       instanceOrProc;
              pTVar8 = (psVar21->field_1).value.second.
                       super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                       .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                       super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                       firstTempVar;
              pRVar9 = (psVar21->field_1).value.second.
                       super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                       .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                       super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                       randomizeDetails;
              (psVar21->field_1).value.second.
              super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
              .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
              super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.assertionInstance =
                   local_58.second.
                   super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                   .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                   super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                   assertionInstance;
              (psVar21->field_1).value.second.
              super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
              .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
              super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar =
                   local_58.second.
                   super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                   .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                   super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar;
              (psVar21->field_1).value.second.
              super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
              .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
              super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.randomizeDetails =
                   local_58.second.
                   super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                   .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                   super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                   randomizeDetails;
              (psVar21->field_1).value.second.
              super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
              .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
              super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits =
                   local_58.second.
                   super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                   .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                   super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits;
              (psVar21->field_1).value.second.
              super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
              .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
              super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc =
                   local_58.second.
                   super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                   .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                   super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc;
              (psVar21->field_1).value.second.
              super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
              .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
              super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr =
                   local_58.second.
                   super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                   .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                   super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr;
              p_Var12 = &(psVar21->field_1).value.second.
                         super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
              ;
              (p_Var12->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
              super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex =
                   local_58.second.
                   super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                   .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                   super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex;
              *(undefined4 *)
               &(p_Var12->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
                super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.field_0xc =
                   local_58.second.
                   super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                   .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                   super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl._12_4_;
              uVar24 = CONCAT31((int3)(uVar24 >> 8),(char)uVar24 + '\x01');
              uVar18 = (ulong)uVar24;
              pPVar22 = pPVar4;
              pSVar23 = pSVar2;
              local_58.second.
              super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
              .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
              super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr =
                   nVar5.ptr;
              local_58.second.
              super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
              .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
              super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl._8_8_ = uVar10;
              local_58.second.
              super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
              .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
              super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits = uVar6
              ;
              local_58.second.
              super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
              .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
              super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc =
                   pSVar7;
              local_58.second.
              super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
              .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
              super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar =
                   pTVar8;
              local_58.second.
              super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
              .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
              super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.randomizeDetails =
                   pRVar9;
              local_58.second.
              super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
              .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
              super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.assertionInstance =
                   pAVar3;
            }
            else {
              uVar18 = CONCAT71((int7)(uVar18 >> 8),cVar16 + '\x01');
              if ((sherwood_v3_table<std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,slang::ast::Symbol_const*,slang::Hasher<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,slang::Hasher<slang::ast::Symbol_const*>>,std::equal_to<slang::ast::Symbol_const*>,ska::detailv3::KeyOrValueEquality<slang::ast::Symbol_const*,std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,std::equal_to<slang::ast::Symbol_const*>>,std::allocator<std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>>
                   )(cVar16 + '\x01') == this[0x11]) {
                key = &local_58;
                local_58.first = (current_entry->field_1).value.first;
                (current_entry->field_1).value.first = pSVar23;
                local_58.second.
                super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                .super__Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false>.
                _M_head_impl = (current_entry->field_1).value.second.
                               super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                               .
                               super__Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false>
                               ._M_head_impl;
                (current_entry->field_1).value.second.
                super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                .super__Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false>.
                _M_head_impl = pPVar22;
                pAVar3 = (current_entry->field_1).value.second.
                         super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                         .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                         super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                         assertionInstance;
                nVar5.ptr = (ptVar1->
                            super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                            ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                            super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.
                            ptr;
                p_Var12 = &(current_entry->field_1).value.second.
                           super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                ;
                uVar11._0_4_ = (p_Var12->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
                               super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                               lookupIndex;
                uVar11._4_4_ = *(undefined4 *)
                                &(p_Var12->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
                                 super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                                 field_0xc;
                uVar6 = (current_entry->field_1).value.second.
                        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                        .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.
                        m_bits;
                pSVar2 = (current_entry->field_1).value.second.
                         super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                         .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                         super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                         instanceOrProc;
                pTVar8 = (current_entry->field_1).value.second.
                         super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                         .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                         super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                         firstTempVar;
                pRVar9 = (current_entry->field_1).value.second.
                         super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                         .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                         super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                         randomizeDetails;
                (current_entry->field_1).value.second.
                super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.assertionInstance
                     = local_58.second.
                       super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                       .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                       super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                       assertionInstance;
                (current_entry->field_1).value.second.
                super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar =
                     local_58.second.
                     super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                     .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                     super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar;
                (current_entry->field_1).value.second.
                super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.randomizeDetails =
                     local_58.second.
                     super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                     .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                     super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                     randomizeDetails;
                (current_entry->field_1).value.second.
                super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits =
                     local_58.second.
                     super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                     .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                     super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits;
                (current_entry->field_1).value.second.
                super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc =
                     local_58.second.
                     super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                     .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                     super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                     instanceOrProc;
                (ptVar1->
                super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr =
                     local_58.second.
                     super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                     .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                     super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr;
                p_Var12 = &(current_entry->field_1).value.second.
                           super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                ;
                (p_Var12->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
                super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex =
                     local_58.second.
                     super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                     .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                     super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex;
                *(undefined4 *)
                 &(p_Var12->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
                  super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.field_0xc =
                     local_58.second.
                     super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                     .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                     super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl._12_4_;
                local_58.second.
                super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr =
                     nVar5.ptr;
                local_58.second.
                super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl._8_8_ = uVar11;
                local_58.second.
                super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits =
                     uVar6;
                local_58.second.
                super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc =
                     pSVar2;
                local_58.second.
                super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar =
                     pTVar8;
                local_58.second.
                super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.randomizeDetails =
                     pRVar9;
                local_58.second.
                super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.assertionInstance
                     = pAVar3;
                goto LAB_003a6432;
              }
            }
            uVar24 = CONCAT31((int3)(uVar24 >> 8),psVar21[1].distance_from_desired);
            psVar20 = psVar21 + 1;
          } while (-1 < psVar21[1].distance_from_desired);
        }
        psVar21[1].field_1.value.first = pSVar23;
        psVar21[1].field_1.value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr =
             local_58.second.
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr;
        p_Var12 = &psVar21[1].field_1.value.second.
                   super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
        ;
        (p_Var12->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex =
             local_58.second.
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex;
        *(undefined4 *)
         &(p_Var12->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
          super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.field_0xc =
             local_58.second.
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl._12_4_;
        psVar21[1].field_1.value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits =
             local_58.second.
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits;
        psVar21[1].field_1.value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc =
             local_58.second.
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc;
        psVar21[1].field_1.value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar =
             local_58.second.
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar;
        psVar21[1].field_1.value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.randomizeDetails =
             local_58.second.
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.randomizeDetails;
        psVar21[1].field_1.value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Tuple_impl<1UL,_slang::ast::ASTContext>.
        super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.assertionInstance =
             local_58.second.
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.assertionInstance;
        psVar21[1].field_1.value.second.
        super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
        super__Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false>._M_head_impl =
             pPVar22;
        psVar20->distance_from_desired = (int8_t)uVar18;
      }
      *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
      auVar28._0_8_ = current_entry;
      auVar28[8] = 1;
      auVar28._9_7_ = (int7)(uVar18 >> 8);
      return (pair<ska::detailv3::sherwood_v3_table<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_const_slang::ast::Symbol_*,_slang::Hasher<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::Hasher<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::equal_to<const_slang::ast::Symbol_*>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>_>::templated_iterator<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_bool>
              )auVar28;
    }
  }
LAB_003a6432:
  sherwood_v3_table<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_const_slang::ast::Symbol_*,_slang::Hasher<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::Hasher<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::equal_to<const_slang::ast::Symbol_*>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>_>
  ::grow((sherwood_v3_table<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_const_slang::ast::Symbol_*,_slang::Hasher<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::Hasher<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Symbol_*,_std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_std::equal_to<const_slang::ast::Symbol_*>_>,_std::allocator<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>_>
          *)this);
  pVar27 = emplace<std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>
                     (this,key);
  return pVar27;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }